

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O2

void __thiscall soplex::SoPlexBase<double>::_restoreLPReal(SoPlexBase<double> *this)

{
  double *pdVar1;
  double dVar2;
  VarStatus *p_rows;
  type_conflict5 tVar3;
  int iVar4;
  ulong in_RAX;
  VarStatus VVar5;
  int i;
  long lVar6;
  long lVar7;
  undefined8 local_38;
  
  if (this->_currentSettings->_intParamValues[0xf] != 2) {
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x29])
              (this->_realLP,&this->_manualLower,0);
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x2c])
              (this->_realLP,&this->_manualUpper,0);
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x32])
              (this->_realLP,&this->_manualLhs,0);
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x35])
              (this->_realLP,&this->_manualRhs,0);
    (*(this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x23])
              (this->_realLP,&this->_manualObj,0);
    return;
  }
  local_38 = in_RAX;
  SPxSolverBase<double>::loadLP(&this->_solver,&this->_manualRealLP,true);
  if (this->_hasBasis == true) {
    lVar7 = 0;
    for (lVar6 = 0; p_rows = (this->_basisStatusRows).data,
        lVar6 < (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                super_SVSetBase<double>.set.thenum; lVar6 = lVar6 + 1) {
      if (p_rows[lVar6] == FIXED) {
        dVar2 = (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.left.val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar6];
        pdVar1 = (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start + lVar6;
        if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
          if ((this->_hasSolRational == true) && (((this->_solRational).field_0xd0 & 4) != 0)) {
            iVar4 = this->_currentSettings->_intParamValues[0];
            if (iVar4 != 1) {
LAB_002bfcf7:
              if (iVar4 == -1) {
                local_38 = local_38 & 0xffffffff00000000;
                tVar3 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                    *)((long)&(((this->_solRational)._dual.val.
                                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              m_backend).m_value.num.m_backend.
                                              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                              .m_data + lVar7),(int *)&local_38);
                VVar5 = ON_UPPER;
                if (tVar3) goto LAB_002bfd1a;
              }
              goto LAB_002bfd18;
            }
            local_38 = local_38 & 0xffffffff;
            tVar3 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)((long)&(((this->_solRational)._dual.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).
                                          m_value.num.m_backend.
                                          super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                          .m_data + lVar7),(int *)((long)&local_38 + 4));
            if (!tVar3) {
              iVar4 = this->_currentSettings->_intParamValues[0];
              goto LAB_002bfcf7;
            }
            VVar5 = ON_UPPER;
          }
          else {
LAB_002bfd18:
            VVar5 = ON_LOWER;
          }
LAB_002bfd1a:
          (this->_basisStatusRows).data[lVar6] = VVar5;
        }
      }
      lVar7 = lVar7 + 0x40;
    }
    SPxSolverBase<double>::setBasis(&this->_solver,p_rows,(this->_basisStatusCols).data);
    this->_hasBasis = NO_PROBLEM < (this->_solver).super_SPxBasisBase<double>.thestatus;
  }
  return;
}

Assistant:

void SoPlexBase<R>::_restoreLPReal()
{
   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_MANUAL)
   {
#ifndef SOPLEX_MANUAL_ALT
      _solver.loadLP(_manualRealLP);
#else
      _realLP->changeLower(_manualLower);
      _realLP->changeUpper(_manualUpper);
      _realLP->changeLhs(_manualLhs);
      _realLP->changeRhs(_manualRhs);
      _realLP->changeObj(_manualObj);
#endif

      if(_hasBasis)
      {
         // in manual sync mode, if the right-hand side of an equality constraint is not floating-point
         // representable, the user might have constructed the constraint in the real LP by rounding down the
         // left-hand side and rounding up the right-hand side; if the basis status is fixed, we need to adjust it
         for(int i = 0; i < _solver.nRows(); i++)
         {
            if(_basisStatusRows[i] == SPxSolverBase<R>::FIXED && _solver.lhs(i) != _solver.rhs(i))
            {
               assert(_solver.rhs(i) == spxNextafter(_solver.lhs(i), R(infinity)));

               if(_hasSolRational && _solRational.isDualFeasible()
                     && ((intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE
                          && _solRational._dual[i] > 0)
                         || (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE
                             && _solRational._dual[i] < 0)))
               {
                  _basisStatusRows[i] = SPxSolverBase<R>::ON_UPPER;
               }
               else
               {
                  _basisStatusRows[i] = SPxSolverBase<R>::ON_LOWER;
               }
            }
         }

         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
         _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
      }
   }
   else
   {
      _realLP->changeLower(_manualLower);
      _realLP->changeUpper(_manualUpper);
      _realLP->changeLhs(_manualLhs);
      _realLP->changeRhs(_manualRhs);
      _realLP->changeObj(_manualObj);
   }
}